

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * has_function_call(AstNode *expr)

{
  AstNode *expr_00;
  AstNode *expr_local;
  
  if (expr == (AstNode *)0x0) {
    expr_local = (AstNode *)0x0;
  }
  else {
    expr_local = expr;
    if (expr->type != EXPR_FUNCTION_CALL) {
      if (expr->type == EXPR_SUFFIXED) {
        if ((expr->field_2).for_stmt.for_statement_list == (AstNodeList *)0x0) {
          expr_local = has_function_call((expr->field_2).function_stmt.function_expr);
        }
        else {
          expr_00 = (AstNode *)
                    raviX_ptrlist_last((PtrList *)(expr->field_2).for_stmt.for_statement_list);
          expr_local = has_function_call(expr_00);
        }
      }
      else {
        expr_local = (AstNode *)0x0;
      }
    }
  }
  return expr_local;
}

Assistant:

static AstNode *has_function_call(AstNode *expr)
{
	if (!expr)
		return NULL;
	if (expr->type == EXPR_FUNCTION_CALL)
		return expr;
	else if (expr->type == EXPR_SUFFIXED) {
		if (expr->suffixed_expr.suffix_list) {
			return has_function_call(
			    (AstNode *)raviX_ptrlist_last((PtrList *)expr->suffixed_expr.suffix_list));
		} else {
			return has_function_call(expr->suffixed_expr.primary_expr);
		}
	} else {
		return NULL;
	}
}